

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.cc
# Opt level: O2

void bloaty::dwarf::SkipLEB128(string_view *data)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = data->_M_len;
  uVar4 = 10;
  if (uVar3 < 10) {
    uVar4 = uVar3;
  }
  uVar5 = 0;
  do {
    if (uVar4 == uVar5) {
      Throw("corrupt DWARF data, unterminated LEB128",0x42);
    }
    uVar1 = uVar5 + 1;
    pcVar2 = data->_M_str + uVar5;
    uVar5 = uVar1;
  } while (*pcVar2 < '\0');
  data->_M_str = data->_M_str + uVar1;
  data->_M_len = uVar3 - uVar1;
  return;
}

Assistant:

void SkipLEB128(string_view* data) {
  size_t limit =
      std::min(static_cast<size_t>(data->size()), static_cast<size_t>(10));
  for (size_t i = 0; i < limit; i++) {
    if (((*data)[i] & 0x80) == 0) {
      data->remove_prefix(i + 1);
      return;
    }
  }

  THROW("corrupt DWARF data, unterminated LEB128");
}